

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
write_padded<duckdb_fmt::v6::internal::float_writer<char>>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>> *this,format_specs *specs,
          float_writer<char> *f)

{
  byte bVar1;
  size_t n;
  byte bVar2;
  char __tmp;
  size_t __len;
  size_t __n;
  size_t __len_1;
  checked_ptr<typename_buffer<char>::value_type> pcVar3;
  ulong uVar4;
  checked_ptr<typename_buffer<char>::value_type> local_30;
  
  uVar4 = (ulong)(uint)specs->width;
  n = f->size_;
  __n = uVar4 - n;
  if (uVar4 < n || __n == 0) {
    local_30 = reserve<duckdb_fmt::v6::internal::buffer<char>,_0>
                         ((back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_> *)this,n);
    float_writer<char>::operator()(f,&local_30);
  }
  else {
    local_30 = reserve<duckdb_fmt::v6::internal::buffer<char>,_0>
                         ((back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_> *)this,
                          uVar4);
    bVar1 = (specs->fill).data_[0];
    bVar2 = specs->field_0x9 & 0xf;
    if (bVar2 == 3) {
      uVar4 = __n >> 1;
      pcVar3 = local_30;
      if (1 < __n) {
        pcVar3 = local_30 + uVar4;
        switchD_014c69ad::default(local_30,(uint)bVar1,uVar4);
      }
      local_30 = pcVar3;
      float_writer<char>::operator()(f,&local_30);
      __n = __n - uVar4;
    }
    else {
      if (bVar2 == 2) {
        pcVar3 = local_30 + __n;
        switchD_014c69ad::default(local_30,(uint)bVar1,__n);
        local_30 = pcVar3;
        float_writer<char>::operator()(f,&local_30);
        return;
      }
      float_writer<char>::operator()(f,&local_30);
    }
    switchD_014c69ad::default(local_30,(uint)bVar1,__n);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }